

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O2

void printT2AddrModeImm8Operand(MCInst *MI,uint OpNum,SStream *O,_Bool AlwaysPrintImm0)

{
  cs_struct *h;
  cs_detail *pcVar1;
  uint uVar2;
  uint uVar3;
  MCOperand *op;
  MCOperand *op_00;
  ulong uVar4;
  char *fmt;
  
  op = MCInst_getOperand(MI,OpNum);
  op_00 = MCInst_getOperand(MI,OpNum + 1);
  SStream_concat0(O,"[");
  set_mem_access(MI,true);
  h = MI->csh;
  uVar2 = MCOperand_getReg(op);
  printRegName(h,O,uVar2);
  if (MI->csh->detail != CS_OPT_OFF) {
    uVar2 = MCOperand_getReg(op);
    pcVar1 = MI->flat_insn->detail;
    *(uint *)(pcVar1->groups + (ulong)(pcVar1->field_6).arm.op_count * 0x30 + 0x45) = uVar2;
  }
  uVar4 = MCOperand_getImm(op_00);
  uVar3 = (uint)uVar4;
  uVar2 = -uVar3;
  if ((int)uVar3 < 0) {
    uVar4 = (ulong)-uVar3;
    fmt = ", #-0x%x";
  }
  else {
    uVar2 = CONCAT31((int3)(uVar2 >> 8),uVar3 == 0);
    if (uVar3 == 0 && !AlwaysPrintImm0) goto LAB_001de5d2;
    if (uVar3 < 10) {
      fmt = ", #%u";
    }
    else {
      fmt = ", #0x%x";
    }
    uVar4 = uVar4 & 0xffffffff;
  }
  SStream_concat(O,fmt,uVar4,(ulong)uVar2);
LAB_001de5d2:
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar1 = MI->flat_insn->detail;
    *(uint *)(pcVar1->groups + (ulong)(pcVar1->field_6).arm.op_count * 0x30 + 0x51) = uVar3;
  }
  SStream_concat0(O,"]");
  set_mem_access(MI,false);
  return;
}

Assistant:

static void printT2AddrModeImm8Operand(MCInst *MI, unsigned OpNum, SStream *O,
		bool AlwaysPrintImm0)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	MCOperand *MO2 = MCInst_getOperand(MI, OpNum+1);
	int32_t OffImm;
	bool isSub;

	SStream_concat0(O, "[");
	set_mem_access(MI, true);

	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);

	OffImm = (int32_t)MCOperand_getImm(MO2);
	isSub = OffImm < 0;
	// Don't print +0.
	if (OffImm == INT32_MIN)
		OffImm = 0;

	if (isSub)
		SStream_concat(O, ", #-0x%x", -OffImm);
	else if (AlwaysPrintImm0 || OffImm > 0) {
		if (OffImm > HEX_THRESHOLD)
			SStream_concat(O, ", #0x%x", OffImm);
		else
			SStream_concat(O, ", #%u", OffImm);
	}

	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.disp = OffImm;
	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}